

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_adapt.c
# Opt level: O2

int arkAdaptImpGus(ARKodeHAdaptMem hadapt_mem,int k,long nst,realtype hcur,realtype ecur,
                  realtype *hnew)

{
  double dVar1;
  double dVar2;
  realtype rVar3;
  realtype rVar4;
  double dVar5;
  
  if (nst < 2) {
    if (ecur <= 1e-10) {
      ecur = 1e-10;
    }
    rVar3 = SUNRpowerR(ecur,-1.0 / (double)k);
    rVar3 = rVar3 * hcur;
  }
  else {
    dVar1 = hadapt_mem->k2;
    if (ecur <= 1e-10) {
      ecur = 1e-10;
    }
    dVar5 = hadapt_mem->ehist[0];
    if (dVar5 <= 1e-10) {
      dVar5 = 1e-10;
    }
    dVar2 = hadapt_mem->hhist[0];
    rVar4 = SUNRpowerR(ecur,-hadapt_mem->k1 / (double)k);
    rVar3 = SUNRpowerR(ecur / dVar5,-dVar1 / (double)k);
    rVar3 = rVar3 * rVar4 * (hcur / dVar2) * hcur;
  }
  *hnew = rVar3;
  return 0;
}

Assistant:

int arkAdaptImpGus(ARKodeHAdaptMem hadapt_mem, int k, long int nst,
                   realtype hcur, realtype ecur, realtype *hnew)
{
  realtype k1, k2, e1, e2, hrat, h_acc;

  /* modified method for first step */
  if (nst < 2) {

    k1 = -ONE / k;
    e1 = SUNMAX(ecur, TINY);
    h_acc = hcur * SUNRpowerR(e1,k1);

  /* general estimate */
  } else {

    k1 = -hadapt_mem->k1 / k;
    k2 = -hadapt_mem->k2 / k;
    e1 = SUNMAX(ecur, TINY);
    e2 = e1 / SUNMAX(hadapt_mem->ehist[0], TINY);
    hrat = hcur / hadapt_mem->hhist[0];
    h_acc = hcur * hrat * SUNRpowerR(e1,k1) * SUNRpowerR(e2,k2);

  }
  *hnew = h_acc;

  return(ARK_SUCCESS);
}